

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::SeekToLast(DBIter *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->direction_ = kReverse;
  ClearSavedValue(this);
  (*this->iter_->_vptr_Iterator[4])();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    FindPrevUserEntry(this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::SeekToLast() {
  direction_ = kReverse;
  ClearSavedValue();
  iter_->SeekToLast();
  FindPrevUserEntry();
}